

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O0

void __thiscall
Storage::Disk::IPF::add_unencoded_data
          (IPF *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track,
          Time bit_length,size_t num_bits)

{
  byte bVar1;
  reference pvVar2;
  pointer pEVar3;
  size_type sVar4;
  ulong local_48;
  size_t c;
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  encoder;
  size_t byte_length;
  value_type *segment;
  size_t num_bits_local;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track_local;
  IPF *this_local;
  Time bit_length_local;
  
  pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
           emplace_back<>(track);
  pvVar2->length_of_a_bit = bit_length;
  encoder._M_t.
  super___uniq_ptr_impl<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_Storage::Encodings::MFM::Encoder_*,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  .super__Head_base<0UL,_Storage::Encodings::MFM::Encoder_*,_false>._M_head_impl =
       (__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
        )(num_bits + 7 >> 3);
  std::vector<bool,_std::allocator<bool>_>::reserve(&pvVar2->data,num_bits << 4);
  Encodings::MFM::GetMFMEncoder((MFM *)&c,&pvVar2->data,(vector<bool,_std::allocator<bool>_> *)0x0);
  for (local_48 = 0; local_48 < num_bits; local_48 = local_48 + 8) {
    pEVar3 = std::
             unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
             ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                           *)&c);
    bVar1 = FileHolder::get8(&this->file_);
    bit_length.length._0_1_ = bVar1;
    (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)bVar1,0,bit_length);
  }
  sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&pvVar2->data);
  if (sVar4 <= (ulong)((long)encoder._M_t.
                             super___uniq_ptr_impl<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Storage::Encodings::MFM::Encoder_*,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                             .super__Head_base<0UL,_Storage::Encodings::MFM::Encoder_*,_false>.
                             _M_head_impl << 4)) {
    std::vector<bool,_std::allocator<bool>_>::resize(&pvVar2->data,num_bits * 2,false);
    std::
    unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
    ::~unique_ptr((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                   *)&c);
    return;
  }
  __assert_fail("segment.data.size() <= (byte_length * 16)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                ,0x19e,
                "void Storage::Disk::IPF::add_unencoded_data(std::vector<Storage::Disk::PCMSegment> &, Time, size_t)"
               );
}

Assistant:

void IPF::add_unencoded_data(std::vector<Storage::Disk::PCMSegment> &track, Time bit_length, size_t num_bits) {
	auto &segment = track.emplace_back();
	segment.length_of_a_bit = bit_length;

	// Length appears to be in pre-encoded bits; double that to get encoded bits.
#ifndef NDEBUG
	const auto byte_length = (num_bits + 7) >> 3;
#endif
	segment.data.reserve(num_bits * 16);

	auto encoder = Storage::Encodings::MFM::GetMFMEncoder(segment.data);
	for(size_t c = 0; c < num_bits; c += 8) {
		encoder->add_byte(file_.get8());
	}

	assert(segment.data.size() <= (byte_length * 16));
	segment.data.resize(num_bits * 2);
}